

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pointer __thiscall
pstore::json::parser<pstore::json::null_output>::
make_terminal_matcher<pstore::json::details::token_matcher<pstore::json::null_output,pstore::json::details::null_complete>,char_const(&)[5]>
          (parser<pstore::json::null_output> *this,char (*args) [5])

{
  pointer psVar1;
  _Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false> extraout_RDX;
  pointer pVar2;
  deleter<pstore::json::details::matcher<pstore::json::null_output>_> local_22 [10];
  char (*args_local) [5];
  parser<pstore::json::null_output> *this_local;
  
  args_local = args;
  this_local = this;
  psVar1 = std::
           unique_ptr<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
           ::operator->((unique_ptr<pstore::json::details::singleton_storage<pstore::json::null_output>,_std::default_delete<pstore::json::details::singleton_storage<pstore::json::null_output>_>_>
                         *)args);
  details::token_matcher<pstore::json::null_output,_pstore::json::details::null_complete>::
  token_matcher();
  details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>::deleter
            (local_22,false);
  std::
  unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>>>
  ::
  unique_ptr<pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>>,void>
            ((unique_ptr<pstore::json::details::matcher<pstore::json::null_output>,pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>>>
              *)this,(pointer)&(psVar1->terminal).__align,local_22);
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  .super__Head_base<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  pVar2._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ._0_8_ = this;
  return (pointer)pVar2._M_t.
                  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::json::null_output>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::json::null_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::json::null_output>_>_>
  ;
}

Assistant:

auto parser<Callbacks>::make_terminal_matcher (Args &&... args) -> pointer {
            static_assert (sizeof (Matcher) <= sizeof (decltype (singletons_->terminal)),
                           "terminal storage is not large enough for Matcher type");
            static_assert (alignof (Matcher) <= alignof (decltype (singletons_->terminal)),
                           "terminal storage is not sufficiently aligned for Matcher type");

            return pointer (new (&singletons_->terminal) Matcher (std::forward<Args> (args)...),
                            typename pointer::deleter_type{false});
        }